

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

__m256 * __thiscall
Sphere::intersect(__m256 *__return_storage_ptr__,Sphere *this,Ray8 *ray,DiffGeom8 *dg)

{
  Sphere SVar1;
  Sphere SVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  __m256 *pafVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar21;
  undefined1 auVar22 [16];
  __m256 b;
  float fVar23;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  __m256 c;
  undefined1 auVar24 [32];
  float fVar33;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar34 [32];
  __m256 a;
  undefined1 auVar35 [32];
  __m256 t1;
  __m256 local_a0;
  __m256 local_80 [2];
  undefined1 auVar20 [32];
  
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(*__return_storage_ptr__ + 2);
  fVar21 = (*__return_storage_ptr__)[4];
  a[1] = fVar21;
  a[0] = fVar21;
  a[2] = fVar21;
  a[3] = fVar21;
  a[4] = fVar21;
  a[5] = fVar21;
  a[6] = fVar21;
  a[7] = fVar21;
  SVar1 = this[4];
  SVar2 = this[5];
  fVar21 = (float)*(ulong *)(*__return_storage_ptr__ + 2);
  c[1] = fVar21;
  c[0] = fVar21;
  c[2] = fVar21;
  c[3] = fVar21;
  c[4] = fVar21;
  c[5] = fVar21;
  c[6] = fVar21;
  c[7] = fVar21;
  auVar20 = vsubps_avx((undefined1  [32])c,(undefined1  [32])*this);
  auVar22 = vmovshdup_avx(auVar22);
  b._0_8_ = auVar22._0_8_;
  b[2] = (float)(int)b._0_8_;
  b[3] = (float)(int)((ulong)b._0_8_ >> 0x20);
  b[4] = (float)(int)b._0_8_;
  b[5] = (float)(int)((ulong)b._0_8_ >> 0x20);
  b[6] = (float)(int)b._0_8_;
  b[7] = (float)(int)((ulong)b._0_8_ >> 0x20);
  auVar19 = vsubps_avx((undefined1  [32])b,(undefined1  [32])this[1]);
  auVar18 = vsubps_avx((undefined1  [32])a,(undefined1  [32])this[2]);
  fVar21 = *(float *)&this[3].super_Geometry._vptr_Geometry;
  fVar23 = *(float *)((long)&this[3].super_Geometry._vptr_Geometry + 4);
  fVar25 = this[3].pos.x;
  fVar26 = this[3].pos.y;
  fVar27 = this[3].pos.z;
  fVar28 = this[3].radius;
  fVar29 = (float)this[3].material_id;
  auVar9._4_4_ = fVar23 * fVar23;
  auVar9._0_4_ = fVar21 * fVar21;
  auVar9._8_4_ = fVar25 * fVar25;
  auVar9._12_4_ = fVar26 * fVar26;
  auVar9._16_4_ = fVar27 * fVar27;
  auVar9._20_4_ = fVar28 * fVar28;
  auVar9._24_4_ = fVar29 * fVar29;
  auVar9._28_4_ = auVar22._4_4_;
  fVar30 = auVar20._0_4_;
  fVar33 = auVar20._4_4_;
  auVar10._4_4_ = fVar33 * fVar23;
  auVar10._0_4_ = fVar30 * fVar21;
  fVar21 = auVar20._8_4_;
  auVar10._8_4_ = fVar21 * fVar25;
  fVar23 = auVar20._12_4_;
  auVar10._12_4_ = fVar23 * fVar26;
  fVar25 = auVar20._16_4_;
  auVar10._16_4_ = fVar25 * fVar27;
  fVar26 = auVar20._20_4_;
  auVar10._20_4_ = fVar26 * fVar28;
  fVar27 = auVar20._24_4_;
  auVar10._24_4_ = fVar27 * fVar29;
  auVar10._28_4_ = *(undefined4 *)&this[3].field_0x1c;
  auVar11._4_4_ = fVar33 * fVar33;
  auVar11._0_4_ = fVar30 * fVar30;
  auVar11._8_4_ = fVar21 * fVar21;
  auVar11._12_4_ = fVar23 * fVar23;
  auVar11._16_4_ = fVar25 * fVar25;
  auVar11._20_4_ = fVar26 * fVar26;
  auVar11._24_4_ = fVar27 * fVar27;
  auVar11._28_4_ = auVar20._28_4_;
  auVar22 = vfmadd231ps_fma(auVar10,auVar19,(undefined1  [32])SVar1);
  auVar13 = vfmadd231ps_fma(auVar9,(undefined1  [32])SVar1,(undefined1  [32])SVar1);
  fVar21 = (*__return_storage_ptr__)[5];
  auVar35._4_4_ = fVar21;
  auVar35._0_4_ = fVar21;
  auVar35._8_4_ = fVar21;
  auVar35._12_4_ = fVar21;
  auVar35._16_4_ = fVar21;
  auVar35._20_4_ = fVar21;
  auVar35._24_4_ = fVar21;
  auVar35._28_4_ = fVar21;
  auVar14 = vfmadd231ps_fma(auVar11,auVar19,auVar19);
  local_a0 = (__m256)(ZEXT832(0) << 0x20);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar18,(undefined1  [32])SVar2);
  auVar19._8_4_ = 0xc0000000;
  auVar19._0_8_ = 0xc0000000c0000000;
  auVar19._12_4_ = 0xc0000000;
  auVar19._16_4_ = 0xc0000000;
  auVar19._20_4_ = 0xc0000000;
  auVar19._24_4_ = 0xc0000000;
  auVar19._28_4_ = 0xc0000000;
  vmulps_avx512vl(ZEXT1632(auVar22),auVar19);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar18,auVar18);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),(undefined1  [32])SVar2,(undefined1  [32])SVar2);
  auVar20 = ZEXT1632(auVar13);
  vfnmadd231ps_fma(ZEXT1632(auVar22),auVar35,auVar35);
  local_80[0] = local_a0;
  pafVar16 = solve_quadratic(local_80,a,b,c,&local_a0,(__m256 *)ray);
  SVar1 = this[7];
  uVar17 = vcmpps_avx512vl((undefined1  [32])local_80[0],(undefined1  [32])this[6],1);
  bVar3 = (bool)((byte)uVar17 & 1);
  auVar18._0_4_ = (uint)bVar3 * (int)local_a0[0] | (uint)!bVar3 * (int)local_80[0][0];
  bVar3 = (bool)((byte)(uVar17 >> 1) & 1);
  auVar18._4_4_ = (uint)bVar3 * (int)local_a0[1] | (uint)!bVar3 * (int)local_80[0][1];
  bVar3 = (bool)((byte)(uVar17 >> 2) & 1);
  auVar18._8_4_ = (uint)bVar3 * (int)local_a0[2] | (uint)!bVar3 * (int)local_80[0][2];
  bVar3 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar18._12_4_ = (uint)bVar3 * (int)local_a0[3] | (uint)!bVar3 * (int)local_80[0][3];
  bVar3 = (bool)((byte)(uVar17 >> 4) & 1);
  auVar18._16_4_ = (uint)bVar3 * (int)local_a0[4] | (uint)!bVar3 * (int)local_80[0][4];
  bVar3 = (bool)((byte)(uVar17 >> 5) & 1);
  auVar18._20_4_ = (uint)bVar3 * (int)local_a0[5] | (uint)!bVar3 * (int)local_80[0][5];
  bVar3 = (bool)((byte)(uVar17 >> 6) & 1);
  auVar18._24_4_ = (uint)bVar3 * (int)local_a0[6] | (uint)!bVar3 * (int)local_80[0][6];
  bVar3 = SUB81(uVar17 >> 7,0);
  auVar18._28_4_ = (uint)bVar3 * (int)local_a0[7] | (uint)!bVar3 * (int)local_80[0][7];
  uVar17 = vcmpps_avx512vl(auVar18,(undefined1  [32])SVar1,1);
  uVar12 = vcmpps_avx512vl((undefined1  [32])this[6],auVar18,1);
  uVar17 = uVar17 & uVar12;
  auVar19 = vmovdqa32_avx512vl(auVar20);
  auVar20._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar19._4_4_;
  auVar20._0_4_ = (uint)((byte)uVar17 & 1) * auVar19._0_4_;
  auVar20._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar19._8_4_;
  auVar20._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar19._12_4_;
  auVar20._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar19._16_4_;
  auVar20._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar19._20_4_;
  auVar20._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar19._24_4_;
  fVar21 = (float)((uint)(byte)(uVar17 >> 7) * auVar19._28_4_);
  auVar20._28_4_ = fVar21;
  auVar19 = vpand_avx2(auVar20,(undefined1  [32])this[8]);
  auVar20 = (undefined1  [32])this[8] & auVar20;
  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0x7f,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar20 >> 0xbf,0) != '\0') ||
      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0') {
    SVar2 = (Sphere)vblendvps_avx((undefined1  [32])SVar1,auVar18,auVar19);
    this[7] = SVar2;
    fVar23 = SVar2.super_Geometry._vptr_Geometry._0_4_;
    fVar25 = SVar2.super_Geometry._vptr_Geometry._4_4_;
    fVar26 = SVar2.pos.x;
    fVar27 = SVar2.pos.y;
    fVar28 = SVar2.pos.z;
    fVar29 = SVar2.radius;
    fVar30 = (float)SVar2.material_id;
    auVar20 = *(undefined1 (*) [32])(ray->d).x;
    auVar31._0_4_ =
         fVar23 * *(float *)&this[3].super_Geometry._vptr_Geometry +
         *(float *)&(this->super_Geometry)._vptr_Geometry;
    auVar31._4_4_ =
         fVar25 * *(float *)((long)&this[3].super_Geometry._vptr_Geometry + 4) +
         *(float *)((long)&(this->super_Geometry)._vptr_Geometry + 4);
    auVar31._8_4_ = fVar26 * this[3].pos.x + (this->pos).x;
    auVar31._12_4_ = fVar27 * this[3].pos.y + (this->pos).y;
    auVar31._16_4_ = fVar28 * this[3].pos.z + (this->pos).z;
    auVar31._20_4_ = fVar29 * this[3].radius + this->radius;
    auVar31._24_4_ = fVar30 * (float)this[3].material_id + (float)this->material_id;
    auVar31._28_4_ = SVar1._28_4_ + *(float *)&this->field_0x1c;
    auVar34._0_4_ =
         fVar23 * *(float *)&this[4].super_Geometry._vptr_Geometry +
         *(float *)&this[1].super_Geometry._vptr_Geometry;
    auVar34._4_4_ =
         fVar25 * *(float *)((long)&this[4].super_Geometry._vptr_Geometry + 4) +
         *(float *)((long)&this[1].super_Geometry._vptr_Geometry + 4);
    auVar34._8_4_ = fVar26 * this[4].pos.x + this[1].pos.x;
    auVar34._12_4_ = fVar27 * this[4].pos.y + this[1].pos.y;
    auVar34._16_4_ = fVar28 * this[4].pos.z + this[1].pos.z;
    auVar34._20_4_ = fVar29 * this[4].radius + this[1].radius;
    auVar34._24_4_ = fVar30 * (float)this[4].material_id + (float)this[1].material_id;
    auVar34._28_4_ = fVar21 + *(float *)&this[1].field_0x1c;
    auVar24._0_4_ =
         fVar23 * *(float *)&this[5].super_Geometry._vptr_Geometry +
         *(float *)&this[2].super_Geometry._vptr_Geometry;
    auVar24._4_4_ =
         fVar25 * *(float *)((long)&this[5].super_Geometry._vptr_Geometry + 4) +
         *(float *)((long)&this[2].super_Geometry._vptr_Geometry + 4);
    auVar24._8_4_ = fVar26 * this[5].pos.x + this[2].pos.x;
    auVar24._12_4_ = fVar27 * this[5].pos.y + this[2].pos.y;
    auVar24._16_4_ = fVar28 * this[5].pos.z + this[2].pos.z;
    auVar24._20_4_ = fVar29 * this[5].radius + this[2].radius;
    auVar24._24_4_ = fVar30 * (float)this[5].material_id + (float)this[2].material_id;
    auVar24._28_4_ = SVar2._28_4_ + *(float *)&this[2].field_0x1c;
    auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).x,auVar31,auVar19);
    auVar9 = vsubps_avx(auVar31,(undefined1  [32])c);
    *(undefined1 (*) [32])(ray->o).x = auVar18;
    auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).y,auVar34,auVar19);
    auVar10 = vsubps_avx(auVar34,(undefined1  [32])b);
    *(undefined1 (*) [32])(ray->o).y = auVar18;
    auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray->o).z,auVar24,auVar19);
    auVar11 = vsubps_avx(auVar24,(undefined1  [32])a);
    *(undefined1 (*) [32])(ray->o).z = auVar18;
    auVar18 = vblendvps_avx(auVar20,auVar9,auVar19);
    auVar9 = vblendvps_avx(*(undefined1 (*) [32])(ray->d).y,auVar10,auVar19);
    auVar20 = *(undefined1 (*) [32])(ray->d).z;
    auVar10 = vblendvps_avx(auVar20,auVar11,auVar19);
    fVar21 = auVar18._0_4_;
    fVar25 = auVar18._4_4_;
    auVar15._4_4_ = fVar25 * fVar25;
    auVar15._0_4_ = fVar21 * fVar21;
    fVar27 = auVar18._8_4_;
    auVar15._8_4_ = fVar27 * fVar27;
    fVar29 = auVar18._12_4_;
    auVar15._12_4_ = fVar29 * fVar29;
    fVar33 = auVar18._16_4_;
    auVar15._16_4_ = fVar33 * fVar33;
    fVar5 = auVar18._20_4_;
    auVar15._20_4_ = fVar5 * fVar5;
    fVar7 = auVar18._24_4_;
    auVar15._24_4_ = fVar7 * fVar7;
    auVar15._28_4_ = auVar20._28_4_;
    auVar22 = vfmadd231ps_fma(auVar15,auVar9,auVar9);
    auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar10,auVar10);
    auVar20 = vsqrtps_avx(ZEXT1632(auVar22));
    auVar20 = vrcpps_avx(auVar20);
    fVar23 = auVar20._0_4_;
    fVar26 = auVar20._4_4_;
    fVar28 = auVar20._8_4_;
    fVar30 = auVar20._12_4_;
    fVar4 = auVar20._16_4_;
    fVar6 = auVar20._20_4_;
    fVar8 = auVar20._24_4_;
    (ray->d).x[0] = fVar21 * fVar23;
    (ray->d).x[1] = fVar25 * fVar26;
    (ray->d).x[2] = fVar27 * fVar28;
    (ray->d).x[3] = fVar29 * fVar30;
    (ray->d).x[4] = fVar33 * fVar4;
    (ray->d).x[5] = fVar5 * fVar6;
    (ray->d).x[6] = fVar7 * fVar8;
    (ray->d).x[7] = auVar18._28_4_;
    (ray->d).y[0] = auVar9._0_4_ * fVar23;
    (ray->d).y[1] = auVar9._4_4_ * fVar26;
    (ray->d).y[2] = auVar9._8_4_ * fVar28;
    (ray->d).y[3] = auVar9._12_4_ * fVar30;
    (ray->d).y[4] = auVar9._16_4_ * fVar4;
    (ray->d).y[5] = auVar9._20_4_ * fVar6;
    (ray->d).y[6] = auVar9._24_4_ * fVar8;
    (ray->d).y[7] = auVar18._28_4_;
    (ray->d).z[0] = auVar10._0_4_ * fVar23;
    (ray->d).z[1] = auVar10._4_4_ * fVar26;
    (ray->d).z[2] = auVar10._8_4_ * fVar28;
    (ray->d).z[3] = auVar10._12_4_ * fVar30;
    (ray->d).z[4] = auVar10._16_4_ * fVar4;
    (ray->d).z[5] = auVar10._20_4_ * fVar6;
    (ray->d).z[6] = auVar10._24_4_ * fVar8;
    (ray->d).z[7] = auVar10._28_4_;
    fVar21 = (*__return_storage_ptr__)[6];
    auVar32._4_4_ = fVar21;
    auVar32._0_4_ = fVar21;
    auVar32._8_4_ = fVar21;
    auVar32._12_4_ = fVar21;
    auVar32._16_4_ = fVar21;
    auVar32._20_4_ = fVar21;
    auVar32._24_4_ = fVar21;
    auVar32._28_4_ = fVar21;
    auVar20 = vblendvps_avx(*(undefined1 (*) [32])ray->t_min,auVar32,auVar19);
    *(undefined1 (*) [32])ray->t_min = auVar20;
  }
  return pafVar16;
}

Assistant:

__m256 Sphere::intersect(Ray8 &ray, DiffGeom8 &dg) const {
	const auto center = Vec3f_8{pos};
	const auto d = center - ray.o;
	const auto a = ray.d.length_sqr();
	const auto b = _mm256_mul_ps(ray.d.dot(d), _mm256_set1_ps(-2.f));
	const auto c = _mm256_fnmadd_ps(_mm256_set1_ps(radius), _mm256_set1_ps(radius), d.dot(d));
	// Solve the quadratic equation and store the mask of potential hits
	// We'll update this mask as we discard other potential hits, eg. due to
	// the hit being beyond the ray's t value
	auto t0 = _mm256_set1_ps(0);
	auto t1 = _mm256_set1_ps(0);
	auto hits = solve_quadratic(a, b, c, t0, t1);
	// We want t0 to hold the nearest t value that is greater than ray.t_min
	auto swap_t = _mm256_cmp_ps(t0, ray.t_min, _CMP_LT_OQ);
	t0 = _mm256_blendv_ps(t0, t1, swap_t);
	// Check which hits are within the ray's t range
	auto in_range = _mm256_and_ps(_mm256_cmp_ps(t0, ray.t_min, _CMP_GT_OQ),
			_mm256_cmp_ps(t0, ray.t_max, _CMP_LT_OQ));
	hits = _mm256_and_ps(hits, in_range);
	hits = _mm256_and_ps(hits, ray.active);
	// Check if all rays miss the sphere
	if (_mm256_movemask_ps(hits) == 0){
		return hits;
	}
	// Update t values for rays that did hit
	ray.t_max = _mm256_blendv_ps(ray.t_max, t0, hits);

	const auto point = ray.at(ray.t_max);
	dg.point.x = _mm256_blendv_ps(dg.point.x, point.x, hits);
	dg.point.y = _mm256_blendv_ps(dg.point.y, point.y, hits);
	dg.point.z = _mm256_blendv_ps(dg.point.z, point.z, hits);
	const auto normal = point - center;
	dg.normal.x = _mm256_blendv_ps(dg.normal.x, normal.x, hits);
	dg.normal.y = _mm256_blendv_ps(dg.normal.y, normal.y, hits);
	dg.normal.z = _mm256_blendv_ps(dg.normal.z, normal.z, hits);
	dg.normal.normalize();
	// There's no blendv_epi32 in AVX/AVX2 so we have to resort to some hacky casting
	dg.material_id = _mm256_castps_si256(_mm256_blendv_ps(_mm256_castsi256_ps(dg.material_id),
			_mm256_castsi256_ps(_mm256_set1_epi32(material_id)), hits));
	return hits;
}